

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holoPlay.cpp
# Opt level: O2

void __thiscall
vera::renderQuilt(vera *this,
                 function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
                 *_renderFnc,int _viewIndex,bool _justQuilt)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Camera *pCVar5;
  undefined4 extraout_var;
  Vbo *this_00;
  socklen_t __len;
  undefined7 in_register_00000009;
  _func_int **pp_Var6;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  uint32_t uVar7;
  uint32_t __fd;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint32_t local_b4;
  int local_b0;
  int _viewIndex_local;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_a8;
  float local_a4;
  undefined8 local_a0;
  GLint viewport [4];
  
  uVar7 = (uint32_t)_renderFnc;
  __len = (socklen_t)CONCAT71(in_register_00000009,_justQuilt);
  __fd = uVar7;
  _viewIndex_local = uVar7;
  pCVar5 = getCamera();
  if (pCVar5 != (Camera *)0x0) {
    if ((char)_viewIndex == '\0') {
      if (quilt_fbo[0x30] == '\0') {
        __len = 1;
        __fd = (uint32_t)quilt;
        Fbo::allocate((Fbo *)quilt_fbo,(uint32_t)quilt,quilt._4_4_,COLOR_TEXTURE_DEPTH_BUFFER,LINEAR
                      ,REPEAT,true);
      }
      iVar1 = (*(pCVar5->super_Node)._vptr_Node[0x4a])(pCVar5);
      __addr = extraout_RDX;
      if (*(int *)CONCAT44(extraout_var,iVar1) != 2) {
        uVar2 = getWindowWidth();
        uVar3 = getWindowHeight();
        pp_Var6 = (pCVar5->super_Node)._vptr_Node;
        (*pp_Var6[0x3e])(pCVar5,(ulong)uVar2,(ulong)uVar3);
        __len = (socklen_t)pp_Var6;
        __fd = 2;
        (*(pCVar5->super_Node)._vptr_Node[0x39])(pCVar5);
        __addr = extraout_RDX_00;
      }
      Fbo::bind((Fbo *)quilt_fbo,__fd,__addr,__len);
    }
    if (uVar7 == 0xffffffff) {
      local_b0 = _viewIndex;
      glGetIntegerv(0xba2,viewport);
      auVar10._0_4_ = (float)(int)(uint32_t)quilt;
      auVar10._4_4_ = (float)(int)quilt._4_4_;
      auVar10._8_8_ = 0;
      auVar11._0_4_ = (float)DAT_004359c0;
      auVar11._4_4_ = (float)_DAT_004359c4;
      auVar11._8_8_ = 0;
      auVar10 = divps(auVar10,auVar11);
      iVar1 = (int)auVar10._0_4_;
      iVar4 = (int)auVar10._4_4_;
      for (local_b4 = 0; _viewIndex = local_b0, (int)local_b4 < DAT_004359c8;
          local_b4 = local_b4 + 1) {
        iVar8 = ((int)local_b4 % DAT_004359c0) * iVar1;
        iVar9 = (int)((float)(int)local_b4 / (float)DAT_004359c0) * iVar4;
        glViewport(iVar8,iVar9,iVar1,iVar4);
        glEnable(0xc11);
        glScissor(iVar8,iVar9,iVar1,iVar4);
        local_a8.x = (float)iVar8;
        local_a4 = (float)iVar9;
        currentViewIndex = local_b4;
        local_a0 = CONCAT44((float)iVar4,(float)iVar1);
        std::
        function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
        ::operator()((function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
                      *)this,(QuiltProperties *)&quilt,(vec<4,_float,_(glm::qualifier)0> *)&local_a8
                     ,(int *)&local_b4);
        glViewport(viewport[0],viewport[1],viewport[2],viewport[3]);
        glDisable(0xc11);
        glScissor(viewport[0],viewport[1],viewport[2],viewport[3]);
      }
    }
    else {
      currentViewIndex = uVar7;
      iVar1 = getWindowWidth();
      iVar4 = getWindowHeight();
      viewport[2] = (GLint)(float)iVar1;
      viewport[3] = (GLint)(float)iVar4;
      viewport[0] = 0;
      viewport[1] = 0;
      std::
      function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
      ::operator()((function<void_(const_vera::QuiltProperties_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
                    *)this,(QuiltProperties *)&quilt,(vec<4,_float,_(glm::qualifier)0> *)viewport,
                   &_viewIndex_local);
    }
    if ((char)_viewIndex == '\0') {
      Fbo::unbind((Fbo *)quilt_fbo);
      Shader::use((Shader *)quilt_shader);
      feedLenticularUniforms((Shader *)quilt_shader);
      std::__cxx11::string::string((string *)viewport,"u_scene",(allocator *)&local_a8);
      Shader::setUniformTexture((Shader *)quilt_shader,(string *)viewport,(Fbo *)quilt_fbo,0);
      std::__cxx11::string::~string((string *)viewport);
      std::__cxx11::string::string((string *)viewport,"u_resolution",(allocator *)&local_a8);
      iVar1 = getWindowWidth();
      iVar4 = getWindowHeight();
      Shader::setUniform((Shader *)quilt_shader,(string *)viewport,(float)iVar1,(float)iVar4);
      std::__cxx11::string::~string((string *)viewport);
      std::__cxx11::string::string
                ((string *)&local_a8,"u_modelViewProjectionMatrix",(allocator *)&local_b4);
      viewport[0] = 0x3f800000;
      viewport[1] = 0;
      viewport[2] = 0;
      viewport[3] = 0;
      Shader::setUniform((Shader *)quilt_shader,(string *)&local_a8,(mat4 *)viewport,false);
      std::__cxx11::string::~string((string *)&local_a8);
      this_00 = getBillboard();
      Vbo::render(this_00,(Shader *)quilt_shader);
    }
  }
  return;
}

Assistant:

void renderQuilt(std::function<void(const QuiltProperties&, glm::vec4&, int&)> _renderFnc, int _viewIndex, bool _justQuilt) {
    Camera* cam = getCamera();
    if (!cam)
        return;

    if (!_justQuilt) {

        if (!quilt_fbo.isAllocated())
            quilt_fbo.allocate(quilt.width, quilt.height, COLOR_TEXTURE_DEPTH_BUFFER);

        if (cam)
            if (cam->getProjectionType() != ProjectionType::PERSPECTIVE_VIRTUAL_OFFSET) {
                // cam->setAspect(1.0);
                cam->setViewport(getWindowWidth(),getWindowHeight());
                // cam->setFOV(glm::radians(14.0f));
                cam->setProjection(ProjectionType::PERSPECTIVE_VIRTUAL_OFFSET);
                // cam->setClipping(0.01, 100.0);
            }

        quilt_fbo.bind();
    }

    if (_viewIndex == -1) {
        // save the viewport for the total quilt
        GLint viewport[4];
        glGetIntegerv(GL_VIEWPORT, viewport);

        // get quilt view dimensions
        int qs_viewWidth = int(float(quilt.width) / float(quilt.columns));
        int qs_viewHeight = int(float(quilt.height) / float(quilt.rows));

        // render views and copy each view to the quilt
        for (int viewIndex = 0; viewIndex < quilt.totalViews; viewIndex++) {
            // get the x and y origin for this view
            int x = (viewIndex % quilt.columns) * qs_viewWidth;
            int y = int(float(viewIndex) / float(quilt.columns)) * qs_viewHeight;

            // get the x and y origin for this view
            // set the viewport to the view to control the projection extent
            glViewport(x, y, qs_viewWidth, qs_viewHeight);

            // // set the scissor to the view to restrict calls like glClear from making modifications
            glEnable(GL_SCISSOR_TEST);
            glScissor(x, y, qs_viewWidth, qs_viewHeight);
            glm::vec4 vp = glm::vec4(x, y, qs_viewWidth, qs_viewHeight);

            currentViewIndex = viewIndex;
            
            _renderFnc(quilt, vp, viewIndex);

            // reset viewport
            glViewport(viewport[0], viewport[1], viewport[2], viewport[3]);

            // // restore scissor
            glDisable(GL_SCISSOR_TEST);
            glScissor(viewport[0], viewport[1], viewport[2], viewport[3]);
        }

    }
    else {
        currentViewIndex = _viewIndex;
        glm::vec4 vp = glm::vec4(0.0, 0.0, float(vera::getWindowWidth()), float(vera::getWindowHeight()));
        _renderFnc(quilt, vp, _viewIndex);
    }

    if (!_justQuilt) {
        quilt_fbo.unbind();

        quilt_shader.use();
        feedLenticularUniforms( quilt_shader );
        quilt_shader.setUniformTexture("u_scene", &quilt_fbo, 0);
        quilt_shader.setUniform("u_resolution", float(vera::getWindowWidth()), float(vera::getWindowHeight()) );
        quilt_shader.setUniform("u_modelViewProjectionMatrix", glm::mat4(1.));
        vera::getBillboard()->render( &quilt_shader );
    }
}